

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_183::InfoCollector::visitArrayGet(InfoCollector *this,ArrayGet *curr)

{
  ArrayGet *curr_00;
  bool bVar1;
  PossibleContents local_38;
  ArrayGet *local_18;
  ArrayGet *curr_local;
  InfoCollector *this_local;
  
  local_18 = curr;
  curr_local = (ArrayGet *)this;
  bVar1 = isRelevant(this,curr->ref);
  curr_00 = local_18;
  if (bVar1) {
    addChildParentLink(this,local_18->ref,(Expression *)local_18);
  }
  else {
    PossibleContents::many();
    addRoot(this,(Expression *)curr_00,&local_38);
    PossibleContents::~PossibleContents(&local_38);
  }
  return;
}

Assistant:

void visitArrayGet(ArrayGet* curr) {
    if (!isRelevant(curr->ref)) {
      addRoot(curr);
      return;
    }
    addChildParentLink(curr->ref, curr);
  }